

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O1

Error __thiscall asmjit::Assembler::embed(Assembler *this,void *data,uint32_t size)

{
  Error EVar1;
  ulong n;
  
  EVar1 = (this->super_CodeEmitter)._lastError;
  if (EVar1 == 0) {
    n = (ulong)size;
    if (((ulong)((long)this->_bufferEnd - (long)this->_bufferPtr) < n) &&
       (EVar1 = CodeHolder::growBuffer((this->super_CodeEmitter)._code,&this->_section->_buffer,n),
       EVar1 != 0)) {
      EVar1 = CodeEmitter::setLastError(&this->super_CodeEmitter,EVar1,(char *)0x0);
    }
    else {
      memcpy(this->_bufferPtr,data,n);
      this->_bufferPtr = this->_bufferPtr + n;
      EVar1 = 0;
      if (((this->super_CodeEmitter)._globalOptions & 4) != 0) {
        Logger::logBinary(((this->super_CodeEmitter)._code)->_logger,data,n);
      }
    }
  }
  return EVar1;
}

Assistant:

Error Assembler::embed(const void* data, uint32_t size) {
  if (_lastError) return _lastError;

  if (getRemainingSpace() < size) {
    Error err = _code->growBuffer(&_section->_buffer, size);
    if (ASMJIT_UNLIKELY(err != kErrorOk)) return setLastError(err);
  }

  ::memcpy(_bufferPtr, data, size);
  _bufferPtr += size;

#if !defined(ASMJIT_DISABLE_LOGGING)
  if (_globalOptions & kOptionLoggingEnabled)
    _code->_logger->logBinary(data, size);
#endif // !ASMJIT_DISABLE_LOGGING

  return kErrorOk;
}